

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_reader.cpp
# Opt level: O0

void __thiscall
duckdb::MultiFileReader::FinalizeChunk
          (MultiFileReader *this,ClientContext *context,MultiFileBindData *bind_data,
          BaseFileReader *reader,MultiFileReaderData *reader_data,DataChunk *input_chunk,
          DataChunk *output_chunk,ExpressionExecutor *executor,
          optional_ptr<duckdb::MultiFileReaderGlobalState,_true> global_state)

{
  size_type sVar1;
  idx_t count_p;
  DataChunk *in_R9;
  DataChunk *in_stack_00000008;
  vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_> *in_stack_00000010
  ;
  string extended_error;
  string first_message;
  string *original_error;
  ErrorData error;
  exception *ex;
  idx_t i;
  DataChunk *in_stack_fffffffffffffdc8;
  ExpressionExecutor *in_stack_fffffffffffffdd0;
  Vector *in_stack_fffffffffffffde0;
  idx_t in_stack_fffffffffffffde8;
  ExpressionExecutor *in_stack_fffffffffffffdf0;
  undefined8 local_40;
  
  ExpressionExecutor::SetChunk(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  local_40 = 0;
  while( true ) {
    sVar1 = ::std::vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>::
            size(in_stack_00000010);
    if (sVar1 <= local_40) break;
    vector<duckdb::Vector,_true>::operator[]
              ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffdd0,
               (size_type)in_stack_fffffffffffffdc8);
    ExpressionExecutor::ExecuteExpression
              (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    local_40 = local_40 + 1;
  }
  count_p = DataChunk::size(in_R9);
  DataChunk::SetCardinality(in_stack_00000008,count_p);
  return;
}

Assistant:

void MultiFileReader::FinalizeChunk(ClientContext &context, const MultiFileBindData &bind_data, BaseFileReader &reader,
                                    const MultiFileReaderData &reader_data, DataChunk &input_chunk,
                                    DataChunk &output_chunk, ExpressionExecutor &executor,
                                    optional_ptr<MultiFileReaderGlobalState> global_state) {
	executor.SetChunk(input_chunk);
	for (idx_t i = 0; i < executor.expressions.size(); i++) {
		try {
			executor.ExecuteExpression(i, output_chunk.data[i]);
		} catch (std::exception &ex) {
			// error while converting - try to create a nice error message
			ErrorData error(ex);
			if (error.Type() == ExceptionType::INTERNAL) {
				throw;
			}
			auto &original_error = error.RawMessage();
			string first_message;
			string extended_error =
			    GetExtendedMultiFileError(bind_data, *executor.expressions[i], reader, i, first_message);
			throw ConversionException("Error while reading file \"%s\": %s: %s\n\n%s", reader.GetFileName(),
			                          first_message, original_error, extended_error);
		}
	}
	output_chunk.SetCardinality(input_chunk.size());
}